

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexAllocFull(int nRegs,int nRealPis,int nFrames)

{
  int iVar1;
  Abc_Cex_t *__s;
  int nWords;
  Abc_Cex_t *pCex;
  int nFrames_local;
  int nRealPis_local;
  int nRegs_local;
  
  iVar1 = Abc_BitWordNum(nRegs + nRealPis * nFrames);
  __s = (Abc_Cex_t *)malloc((long)iVar1 * 4 + 0x14);
  memset(__s,0xff,(long)iVar1 * 4 + 0x14);
  __s->nRegs = nRegs;
  __s->nPis = nRealPis;
  __s->nBits = nRegs + nRealPis * nFrames;
  return __s;
}

Assistant:

Abc_Cex_t * Abc_CexAllocFull( int nRegs, int nRealPis, int nFrames )
{
    Abc_Cex_t * pCex;
    int nWords = Abc_BitWordNum( nRegs + nRealPis * nFrames );
    pCex = (Abc_Cex_t *)ABC_ALLOC( char, sizeof(Abc_Cex_t) + sizeof(unsigned) * nWords );
    memset( pCex, 0xFF, sizeof(Abc_Cex_t) + sizeof(unsigned) * nWords );
    pCex->nRegs  = nRegs;
    pCex->nPis   = nRealPis;
    pCex->nBits  = nRegs + nRealPis * nFrames;
    return pCex;
}